

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakDetectorTest_OneAllocAndFree_Test::testBody
          (TEST_MemoryLeakDetectorTest_OneAllocAndFree_Test *this)

{
  MemoryLeakDetector *pMVar1;
  bool bVar2;
  TestMemoryAllocator *pTVar3;
  char *memory;
  char *memory_00;
  UtestShell *pUVar4;
  size_t sVar5;
  TestTerminator *pTVar6;
  char *otherBuffer;
  SimpleString output;
  SimpleString local_50;
  SimpleString local_40;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultMallocAllocator();
  memory = MemoryLeakDetector::allocMemory(pMVar1,pTVar3,10,"file.cpp",0x4d2,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultMallocAllocator();
  memory_00 = MemoryLeakDetector::allocMemory(pMVar1,pTVar3,0xc,false);
  pUVar4 = UtestShell::getCurrent();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,2,sVar5,
             "LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x155,pTVar6);
  otherBuffer = MemoryLeakDetector::report
                          ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                           mem_leak_period_checking);
  SimpleString::SimpleString(&local_40,otherBuffer);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_50,"malloc");
  bVar2 = SimpleString::contains(&local_40,&local_50);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar2,"CHECK","output.contains(\"malloc\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x157,pTVar6);
  SimpleString::~SimpleString(&local_50);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultMallocAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar3,memory,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultMallocAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar3,memory_00,"file.c",0x162e,false);
  pUVar4 = UtestShell::getCurrent();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0,sVar5,"LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x15a,pTVar6);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneAllocAndFree)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 10, "file.cpp", 1234);
    char* mem2 = detector->allocMemory(defaultMallocAllocator(), 12);
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking));
    SimpleString output = detector->report(mem_leak_period_checking);
    CHECK(output.contains("malloc"));
    detector->deallocMemory(defaultMallocAllocator(), mem);
    detector->deallocMemory(defaultMallocAllocator(), mem2, "file.c", 5678);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->stopChecking();
}